

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O3

MPP_RET h264e_dpb_setup(H264eDpb *dpb,MppEncCfgSet *cfg,H264eSps *sps)

{
  uint uVar1;
  int iVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  MppEncCpbInfo *pMVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pMVar10 = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_setup",dpb);
  }
  uVar1 = sps->num_ref_frames;
  uVar13 = sps->log2_max_frame_num_minus4 + 4;
  uVar11 = sps->log2_max_poc_lsb_minus4 + 4;
  h264e_dpb_init(dpb,dpb->reorder,dpb->marking);
  RVar3 = pMVar10->max_lt_cnt;
  RVar4 = pMVar10->max_st_cnt;
  RVar5 = pMVar10->max_lt_idx;
  RVar6 = pMVar10->max_lt_idx;
  RVar7 = pMVar10->max_st_tid;
  RVar8 = pMVar10->lt_gop;
  RVar9 = pMVar10->st_gop;
  (dpb->info).dpb_size = pMVar10->dpb_size;
  (dpb->info).max_lt_cnt = RVar3;
  (dpb->info).max_st_cnt = RVar4;
  (dpb->info).max_lt_idx = RVar5;
  (dpb->info).max_lt_idx = RVar6;
  (dpb->info).max_st_tid = RVar7;
  (dpb->info).lt_gop = RVar8;
  (dpb->info).st_gop = RVar9;
  iVar2 = pMVar10->dpb_size;
  dpb->dpb_size = iVar2;
  uVar12 = iVar2 + 1;
  dpb->total_cnt = uVar12;
  dpb->max_frm_num = 1 << ((byte)uVar13 & 0x1f);
  dpb->max_poc_lsb = 1 << ((byte)uVar11 & 0x1f);
  dpb->poc_type = sps->pic_order_cnt_type;
  if ((cfg->hw).extra_buf != 0) {
    uVar12 = iVar2 + 2;
    dpb->total_cnt = uVar12;
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","max  ref frm num %d total slot %d\n","h264e_dpb_setup",(ulong)uVar1,
               (ulong)uVar12);
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","log2 max frm num %d -> %d\n","h264e_dpb_setup",(ulong)uVar13,
                 (ulong)(uint)dpb->max_frm_num);
      if ((h264e_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"h264e_dpb","log2 max poc lsb %d -> %d\n","h264e_dpb_setup",(ulong)uVar11,
                   (ulong)(uint)dpb->max_poc_lsb);
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_setup",dpb);
        }
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_dpb_setup(H264eDpb *dpb, MppEncCfgSet* cfg, H264eSps *sps)
{
    MPP_RET ret = MPP_OK;
    MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);

    h264e_dbg_dpb("enter %p\n", dpb);

    RK_S32 ref_frm_num = sps->num_ref_frames;
    RK_S32 log2_max_frm_num = sps->log2_max_frame_num_minus4 + 4;
    RK_S32 log2_max_poc_lsb = sps->log2_max_poc_lsb_minus4 + 4;

    /* NOTE: new configure needs to clear dpb first */
    h264e_dpb_init(dpb, dpb->reorder, dpb->marking);

    memcpy(&dpb->info, info, sizeof(dpb->info));
    dpb->dpb_size = info->dpb_size;
    dpb->total_cnt = info->dpb_size + 1;
    dpb->max_frm_num = 1 << log2_max_frm_num;
    dpb->max_poc_lsb = (1 << log2_max_poc_lsb);
    dpb->poc_type = sps->pic_order_cnt_type;

    if (cfg->hw.extra_buf)
        dpb->total_cnt++;

    h264e_dbg_dpb("max  ref frm num %d total slot %d\n",
                  ref_frm_num, dpb->total_cnt);
    h264e_dbg_dpb("log2 max frm num %d -> %d\n",
                  log2_max_frm_num, dpb->max_frm_num);
    h264e_dbg_dpb("log2 max poc lsb %d -> %d\n",
                  log2_max_poc_lsb, dpb->max_poc_lsb);

    h264e_dbg_dpb("leave %p\n", dpb);

    return ret;
}